

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O2

bool __thiscall Node::is_canonical(Node *this)

{
  char cVar1;
  pointer pcVar2;
  ostream *poVar3;
  char cVar4;
  size_type sVar5;
  ulong uVar6;
  
  sVar5 = (this->sequence)._M_string_length;
  uVar6 = 0;
  while( true ) {
    sVar5 = sVar5 - 1;
    if (sVar5 <= uVar6) {
      return true;
    }
    pcVar2 = (this->sequence)._M_dataplus._M_p;
    cVar1 = pcVar2[uVar6];
    cVar4 = pcVar2[sVar5];
    if (cVar4 == 'T') {
      cVar4 = 'A';
    }
    else if (cVar4 == 'C') {
      cVar4 = 'G';
    }
    else if (cVar4 == 'G') {
      cVar4 = 'C';
    }
    else if (cVar4 != 'N') {
      if (cVar4 == 'A') {
        cVar4 = 'T';
      }
      else {
        poVar3 = sdglib::OutputLog(WARN,true);
        poVar3 = std::operator<<(poVar3,"Unexpected character in fasta file: \'");
        poVar3 = std::operator<<(poVar3,cVar4);
        poVar3 = std::operator<<(poVar3,"\'");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    if (cVar1 < cVar4) break;
    uVar6 = uVar6 + 1;
    if (cVar4 < cVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Node::is_canonical() {
    for (size_t i=0,j=sequence.size()-1;i<j;++i,--j){
        char f=sequence[i];
        char r=sequence[j];
        switch(r){
            case 'A':
                r='T';
                break;
            case 'C':
                r='G';
                break;
            case 'G':
                r='C';
                break;
            case 'T':
                r='A';
                break;
            case 'N':
                break;
            default:
                sdglib::OutputLog(sdglib::LogLevels::WARN) << "Unexpected character in fasta file: '" << r << "'" << std::endl;
        }
        if (f<r) return true;
        if (r<f) return false;
    }
    return true;
}